

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall
CTxMemPoolEntry::UpdateAncestorState
          (CTxMemPoolEntry *this,int32_t modifySize,CAmount modifyFee,int64_t modifyCount,
          int64_t modifySigOps)

{
  int64_t *piVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = &this->nSizeWithAncestors;
  lVar3 = *piVar1;
  *piVar1 = *piVar1 + (long)modifySize;
  if (*piVar1 == 0 || SCARRY8(lVar3,(long)modifySize) != *piVar1 < 0) {
    __assert_fail("nSizeWithAncestors > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                  ,0x188,
                  "void CTxMemPoolEntry::UpdateAncestorState(int32_t, CAmount, int64_t, int64_t)");
  }
  lVar3 = SaturatingAdd<long>(this->nModFeesWithAncestors,modifyFee);
  this->nModFeesWithAncestors = lVar3;
  piVar1 = &this->m_count_with_ancestors;
  lVar3 = *piVar1;
  *piVar1 = *piVar1 + modifyCount;
  if (*piVar1 == 0 || SCARRY8(lVar3,modifyCount) != *piVar1 < 0) {
    __assert_fail("m_count_with_ancestors > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                  ,0x18b,
                  "void CTxMemPoolEntry::UpdateAncestorState(int32_t, CAmount, int64_t, int64_t)");
  }
  lVar3 = modifySigOps + this->nSigOpCostWithAncestors;
  this->nSigOpCostWithAncestors = lVar3;
  if ((int)lVar3 < 0) {
    __assert_fail("int(nSigOpCostWithAncestors) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                  ,0x18d,
                  "void CTxMemPoolEntry::UpdateAncestorState(int32_t, CAmount, int64_t, int64_t)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPoolEntry::UpdateAncestorState(int32_t modifySize, CAmount modifyFee, int64_t modifyCount, int64_t modifySigOps)
{
    nSizeWithAncestors += modifySize;
    assert(nSizeWithAncestors > 0);
    nModFeesWithAncestors = SaturatingAdd(nModFeesWithAncestors, modifyFee);
    m_count_with_ancestors += modifyCount;
    assert(m_count_with_ancestors > 0);
    nSigOpCostWithAncestors += modifySigOps;
    assert(int(nSigOpCostWithAncestors) >= 0);
}